

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void ZSTD_buildFSETable_body_bmi2
               (ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,U32 *baseValue,
               U8 *nbAdditionalBits,uint tableLog,void *wksp,size_t wkspSize)

{
  short sVar1;
  sbyte sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 uVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ushort uVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa655,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa656,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  if (wkspSize < 0x272) {
    __assert_fail("wkspSize >= ZSTD_BUILD_FSE_TABLE_WKSP_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa657,
                  "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                 );
  }
  uVar6 = 1 << (tableLog & 0x1f);
  sVar2 = ((byte)tableLog < 0x21) * (' ' - (byte)tableLog);
  uVar8 = (uint)(-1 << sVar2) >> sVar2;
  uVar7 = (uint)(0x8000 << (tableLog & 0x1f)) >> 0x10;
  uVar9 = 1;
  uVar13 = 0;
  uVar10 = uVar8;
  do {
    uVar14 = normalizedCounter[uVar13];
    if (uVar14 == 0xffff) {
      uVar11 = (ulong)uVar10;
      uVar10 = uVar10 - 1;
      dt[uVar11 + 1].baseValue = (U32)uVar13;
      uVar14 = 1;
    }
    else {
      if ((short)uVar14 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa665,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      if (uVar7 < uVar14 || uVar7 == uVar14) {
        uVar9 = 0;
      }
    }
    *(ushort *)((long)wksp + uVar13 * 2) = uVar14;
    uVar13 = uVar13 + 1;
  } while (maxSymbolValue + 1 != uVar13);
  dt->nextState = (short)uVar9;
  dt->nbAdditionalBits = (char)((uint)uVar9 >> 0x10);
  dt->nbBits = (char)((uint)uVar9 >> 0x18);
  dt->baseValue = tableLog;
  auVar4 = _DAT_001e3030;
  auVar3 = _DAT_001e2fc0;
  if (uVar10 == uVar8) {
    iVar12 = (uVar6 >> 3) + (uVar6 >> 1) + 3;
    lVar16 = 0;
    lVar15 = 0;
    uVar10 = 0;
    do {
      uVar14 = normalizedCounter[uVar10];
      *(long *)((long)wksp + lVar16 + 0x6a) = lVar15;
      if (8 < (long)(short)uVar14) {
        uVar5 = 0x10;
        if (0x10 < uVar14) {
          uVar5 = uVar14;
        }
        uVar11 = (ulong)uVar5 - 9;
        auVar20._8_4_ = (int)uVar11;
        auVar20._0_8_ = uVar11;
        auVar20._12_4_ = (int)(uVar11 >> 0x20);
        auVar18._0_8_ = uVar11 >> 3;
        auVar18._8_8_ = auVar20._8_8_ >> 3;
        auVar18 = auVar18 ^ auVar4;
        uVar13 = 0;
        do {
          auVar19._8_4_ = (int)uVar13;
          auVar19._0_8_ = uVar13;
          auVar19._12_4_ = (int)(uVar13 >> 0x20);
          auVar20 = (auVar19 | auVar3) ^ auVar4;
          if ((bool)(~(auVar18._4_4_ < auVar20._4_4_ ||
                      auVar18._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar18._4_4_) & 1)) {
            *(long *)((long)wksp + uVar13 * 8 + lVar16 + 0x72) = lVar15;
          }
          if (auVar20._12_4_ <= auVar18._12_4_ &&
              (auVar20._8_4_ <= auVar18._8_4_ || auVar20._12_4_ != auVar18._12_4_)) {
            *(long *)((long)wksp + uVar13 * 8 + lVar16 + 0x7a) = lVar15;
          }
          uVar13 = uVar13 + 2;
        } while (((uVar11 >> 3) + 2 & 0xfffffffffffffffe) != uVar13);
      }
      if ((short)uVar14 < 0) {
        __assert_fail("n>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xa687,
                      "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                     );
      }
      lVar16 = lVar16 + (short)uVar14;
      lVar15 = lVar15 + 0x101010101010101;
      bVar17 = uVar10 != maxSymbolValue;
      uVar10 = uVar10 + 1;
    } while (bVar17);
    if ((uVar6 & 1) != 0) {
      __assert_fail("tableSize % unroll == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa695,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
    uVar13 = 0;
    uVar10 = 0;
    do {
      dt[(ulong)(uVar10 & uVar8) + 1].baseValue = (uint)*(byte *)((long)wksp + uVar13 + 0x6a);
      dt[(ulong)(uVar10 + iVar12 & uVar8) + 1].baseValue =
           (uint)*(byte *)((long)wksp + uVar13 + 0x6b);
      uVar10 = uVar10 + iVar12 * 2 & uVar8;
      uVar13 = uVar13 + 2;
    } while (uVar13 < uVar6);
    if (uVar10 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa69e,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  else {
    uVar13 = 0;
    uVar7 = 0;
    do {
      sVar1 = normalizedCounter[uVar13];
      if (0 < sVar1) {
        iVar12 = 0;
        do {
          dt[(ulong)uVar7 + 1].baseValue = (U32)uVar13;
          do {
            uVar7 = uVar7 + (uVar6 >> 1) + (uVar6 >> 3) + 3 & uVar8;
          } while (uVar10 < uVar7);
          iVar12 = iVar12 + 1;
        } while (iVar12 != sVar1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != maxSymbolValue + 1);
    if (uVar7 != 0) {
      __assert_fail("position == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xa6ac,
                    "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
                   );
    }
  }
  uVar13 = 0;
  while( true ) {
    uVar11 = (ulong)dt[uVar13 + 1].baseValue;
    uVar14 = *(ushort *)((long)wksp + uVar11 * 2);
    *(ushort *)((long)wksp + uVar11 * 2) = uVar14 + 1;
    iVar12 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> iVar12 == 0; iVar12 = iVar12 + -1) {
      }
    }
    dt[uVar13 + 1].nbBits = (BYTE)(tableLog - iVar12);
    dt[uVar13 + 1].nextState = (uVar14 << (tableLog - iVar12 & 0x1f)) - (short)uVar6;
    if (nbAdditionalBits[uVar11] == 0xff) break;
    dt[uVar13 + 1].nbAdditionalBits = nbAdditionalBits[uVar11];
    dt[uVar13 + 1].baseValue = baseValue[uVar11];
    uVar13 = uVar13 + 1;
    if (uVar6 == uVar13) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0xa6b7,
                "void ZSTD_buildFSETable_body(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U8 *, unsigned int, void *, size_t)"
               );
}

Assistant:

BMI2_TARGET_ATTRIBUTE static void ZSTD_buildFSETable_body_bmi2(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U8* nbAdditionalBits,
            unsigned tableLog, void* wksp, size_t wkspSize)
{
    ZSTD_buildFSETable_body(dt, normalizedCounter, maxSymbolValue,
            baseValue, nbAdditionalBits, tableLog, wksp, wkspSize);
}